

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

bool __thiscall
soplex::SPxSolverBase<double>::leave(SPxSolverBase<double> *this,int leaveIdx,bool polish)

{
  double dVar1;
  bool bVar2;
  UpdateVector<double> *pUVar3;
  SSVectorBase<double> *pSVar4;
  SSVectorBase<double> *pSVar5;
  SSVectorBase<double> *pSVar6;
  SLinSolver<double> *pSVar7;
  pointer pdVar8;
  pointer pdVar9;
  Tolerances *this_00;
  SVectorBase<double> *pSVar10;
  Real RVar11;
  char cVar12;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar13;
  int iVar14;
  int extraout_var;
  undefined4 extraout_var_00;
  long lVar15;
  SPxOut *pSVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  VectorBase<double> *pVVar20;
  SSVectorBase<double> *pSVar21;
  byte bVar22;
  long in_FS_OFFSET;
  ulong uVar23;
  undefined4 uVar24;
  uint uVar25;
  undefined4 uVar26;
  Status leaveStat;
  int leaveNum;
  double enterBound;
  double enterVal;
  double newUBbound;
  double leaveMax;
  SPxId enterId;
  SPxId leaveId;
  SPxId none;
  double leavebound;
  double newCoPrhs;
  double newLBbound;
  uint local_11c;
  SPxBasisBase<double> *local_118;
  undefined8 uStack_110;
  uint local_fc;
  Verbosity local_f8;
  undefined4 uStack_f4;
  double local_f0;
  double local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  double local_d0;
  double local_c8;
  double dStack_c0;
  DataKey local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  double local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_7c;
  SVectorBase<double> *local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58 [5];
  SVectorBase<double> *rhs;
  
  bVar2 = this->instableLeave;
  pUVar3 = this->theCoPvec;
  if (((pUVar3->thedelta).setupStatus == true) && ((pUVar3->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<double>::coSolve
              (&this->super_SPxBasisBase<double>,&pUVar3->thedelta,
               &(this->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[leaveIdx].super_SVectorBase<double>);
  }
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])(this);
  local_b0 = 0xffffffff00000000;
  local_a8 = 0xffffffff00000000;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7f])
            (this,(ulong)(uint)leaveIdx,&local_11c,&local_b0,&local_d0,&local_a0,&local_fc,&local_c8
            );
  if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[(ulong)(0.0 < local_d0) + 0x8b])
              (this);
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
  }
  local_f0 = local_d0;
  this->boundflips = 0;
  local_118 = (SPxBasisBase<double> *)this->theShift;
  local_b8.info =
       (*this->theratiotester->_vptr_SPxRatioTester[8])
                 (this->theratiotester,&local_f0,(ulong)(uint)leaveIdx,(ulong)polish);
  local_b8.idx = extraout_var;
  local_e8 = this->theShift;
  uStack_e0 = 0;
  RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  if (RVar11 < ABS(local_e8 - (double)local_118)) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
  }
  this->instableLeaveNum = -1;
  this->instableLeave = false;
  if (local_b8.info == 0) {
    bVar22 = 0;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
              (this,(ulong)local_fc,local_b0,(ulong)local_11c,0);
    (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (&this->super_SPxBasisBase<double>,0xffffffff,&local_a8,0,0);
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    if (polish) goto LAB_001d1872;
    local_118 = (SPxBasisBase<double> *)(local_f0 - local_d0);
    uStack_110 = 0;
    RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (ABS((double)local_118) <= RVar11 || (bVar2 & 1U) != 0) {
      if (1 < (this->super_SPxBasisBase<double>).updateCount) {
        pSVar16 = this->spxout;
        if ((pSVar16 != (SPxOut *)0x0) && (4 < (int)pSVar16->m_verbosity)) {
          local_d8 = 5;
          local_f8 = pSVar16->m_verbosity;
          (*pSVar16->_vptr_SPxOut[2])();
          pSVar16 = this->spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar16->m_streams[pSVar16->m_verbosity],"ILEAVE01 factorization triggered in "
                     ,0x24);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar16->m_streams[pSVar16->m_verbosity],"leave() for feasibility test",0x1c);
          cVar12 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) +
                          cVar12);
          std::ostream::put(cVar12);
          std::ostream::flush();
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_f8);
        }
        bVar22 = 1;
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
        goto LAB_001d1872;
      }
      if (this->recomputedVectors == false) {
        local_118 = (SPxBasisBase<double> *)ABS(local_f0);
        uStack_110 = 0;
        dVar1 = leavetol(this);
        if ((double)local_118 < dVar1) {
          pSVar16 = this->spxout;
          if ((pSVar16 != (SPxOut *)0x0) && (4 < (int)pSVar16->m_verbosity)) {
            local_d8 = 5;
            local_f8 = pSVar16->m_verbosity;
            (*pSVar16->_vptr_SPxOut[2])();
            pSVar16 = soplex::operator<<(this->spxout,
                                         "ILEAVE11 clean up step to reduce numerical errors");
            std::endl<char,std::char_traits<char>>(pSVar16->m_streams[pSVar16->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_f8);
          }
          computeFrhs(this);
          SPxBasisBase<double>::solve
                    (&this->super_SPxBasisBase<double>,&this->theFvec->super_VectorBase<double>,
                     this->theFrhs);
          computeFtest(this);
          this->recomputedVectors = true;
          goto LAB_001d186f;
        }
      }
      pSVar16 = this->spxout;
      if ((pSVar16 != (SPxOut *)0x0) && (4 < (int)pSVar16->m_verbosity)) {
        local_d8 = 5;
        local_f8 = pSVar16->m_verbosity;
        (*pSVar16->_vptr_SPxOut[2])();
        pSVar16 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar16->m_streams[pSVar16->m_verbosity],
                   "ILEAVE02 unboundedness/infeasibility found ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar16->m_streams[pSVar16->m_verbosity],"in leave()",10);
        cVar12 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) + cVar12)
        ;
        std::ostream::put(cVar12);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_f8);
      }
      if (this->theRep == COLUMN) {
        computeDualfarkas4Col(this,local_f0);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->super_SPxBasisBase<double>).thestatus != INFEASIBLE) {
          (this->super_SPxBasisBase<double>).thestatus = INFEASIBLE;
        }
      }
      else {
        computePrimalray4Row(this,local_f0);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->super_SPxBasisBase<double>).thestatus != UNBOUNDED) {
          (this->super_SPxBasisBase<double>).thestatus = UNBOUNDED;
        }
      }
      bVar22 = 0;
      goto LAB_001d1872;
    }
    pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->instableLeaveNum = leaveIdx;
    dVar1 = pdVar8[leaveIdx];
    this->instableLeaveVal = dVar1;
    pdVar8[leaveIdx] = dVar1 / 10.0;
  }
  else {
    local_e8 = (double)CONCAT71(local_e8._1_7_,bVar2);
    lVar19 = (long)leaveIdx;
    if (&local_b8 == &(this->super_SPxBasisBase<double>).theBaseId.data[lVar19].super_DataKey) {
      (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (&this->super_SPxBasisBase<double>,(ulong)(uint)leaveIdx,&local_a8,0,0);
      pDVar13 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
      if ((int)local_b0 < 0) {
        pDVar13 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
      }
      lVar15 = (long)(int)local_fc;
      if (local_11c == 0xfffffffe) {
        pDVar13->data[lVar15] = P_ON_LOWER;
        pVVar20 = &this->theLCbound;
        if ((int)local_b0 < 0) {
          pVVar20 = &this->theLRbound;
        }
        (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] =
             (pVVar20->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar15];
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = 0.0;
        ::soplex::infinity::__tls_init();
        uVar24 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
        uVar25 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20) ^ 0x80000000;
      }
      else {
        pVVar20 = &this->theUCbound;
        if ((int)local_b0 < 0) {
          pVVar20 = &this->theURbound;
        }
        pDVar13->data[lVar15] = P_ON_UPPER;
        (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] =
             (pVVar20->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar15];
        ::soplex::infinity::__tls_init();
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = *(double *)(in_FS_OFFSET + -8);
        uVar24 = 0;
        uVar25 = 0;
      }
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar19] = (double)CONCAT44(uVar25,uVar24);
      local_118 = (SPxBasisBase<double> *)local_f0;
      this->theCoPvec->theval = local_f0;
      this->thePvec->theval = local_f0;
      RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar11 < (double)local_118) {
LAB_001d0f56:
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
      }
      else {
        local_118 = (SPxBasisBase<double> *)local_f0;
        RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if ((double)local_118 < -RVar11) goto LAB_001d0f56;
      }
      this->theFvec->theval = 0.0;
      pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->m_pricingViol = pdVar8[lVar19] + this->m_pricingViol;
      pdVar8[lVar19] = -pdVar8[lVar19];
    }
    else {
      local_118 = &this->super_SPxBasisBase<double>;
      local_7c = leaveIdx;
      iVar14 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                 super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])(this,&local_b8);
      rhs = (SVectorBase<double> *)CONCAT44(extraout_var_00,iVar14);
      pSVar4 = this->solveVector2;
      if (pSVar4 == (SSVectorBase<double> *)0x0) {
LAB_001d102a:
        pSVar4 = this->solveVector3;
        pSVar21 = &this->theFvec->thedelta;
        if (pSVar4 == (SSVectorBase<double> *)0x0) {
          SPxBasisBase<double>::solve4update(local_118,pSVar21,rhs);
        }
        else {
          pSVar5 = this->solveVector3rhs;
          if ((this->super_SPxBasisBase<double>).factorized == false) {
            SPxBasisBase<double>::factorize(local_118);
          }
          pSVar7 = (this->super_SPxBasisBase<double>).factor;
          (*pSVar7->_vptr_SLinSolver[0x11])(pSVar7,pSVar21,pSVar4,rhs,pSVar5);
          pSVar4 = this->solveVector3;
          if (pSVar4->setupStatus == true) {
            lVar15 = (long)(pSVar4->super_IdxSet).num;
            if (0 < lVar15) {
              piVar18 = (pSVar4->super_IdxSet).idx;
              pdVar8 = (pSVar4->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar9 = (this->primVec).super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = lVar15 + 1;
              do {
                iVar14 = piVar18[lVar15 + -2];
                pdVar9[iVar14] = pdVar9[iVar14] - pdVar8[iVar14];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          else {
            pdVar8 = (this->primVec).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar25 = (uint)((ulong)((long)(this->primVec).super_VectorBase<double>.val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8)
                           >> 3);
            if (0 < (int)uVar25) {
              pdVar9 = (pSVar4->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = (ulong)(uVar25 & 0x7fffffff) + 1;
              do {
                pdVar8[lVar15 + 0xfffffffffffffffe] =
                     pdVar8[lVar15 + 0xfffffffffffffffe] - pdVar9[lVar15 + -2];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
LAB_001d117e:
          this->totalboundflips = this->totalboundflips + this->boundflips;
        }
      }
      else {
        pSVar21 = this->solveVector3;
        if (pSVar21 != (SSVectorBase<double> *)0x0) {
          pUVar3 = this->theFvec;
          pSVar5 = this->solveVector2rhs;
          pSVar6 = this->solveVector3rhs;
          local_98 = (double)lVar19;
          local_78 = rhs;
          if ((this->super_SPxBasisBase<double>).factorized == false) {
            SPxBasisBase<double>::factorize(local_118);
          }
          rhs = local_78;
          pSVar7 = (this->super_SPxBasisBase<double>).factor;
          (*pSVar7->_vptr_SLinSolver[0x13])
                    (pSVar7,&pUVar3->thedelta,pSVar4,pSVar21,local_78,pSVar5,pSVar6);
          pSVar4 = this->solveVector3;
          lVar19 = (long)local_98;
          if (pSVar4->setupStatus == true) {
            lVar15 = (long)(pSVar4->super_IdxSet).num;
            if (0 < lVar15) {
              piVar18 = (pSVar4->super_IdxSet).idx;
              pdVar8 = (pSVar4->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar9 = (this->primVec).super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = lVar15 + 1;
              do {
                iVar14 = piVar18[lVar15 + -2];
                pdVar9[iVar14] = pdVar9[iVar14] - pdVar8[iVar14];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          else {
            pdVar8 = (this->primVec).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar25 = (uint)((ulong)((long)(this->primVec).super_VectorBase<double>.val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8)
                           >> 3);
            if (0 < (int)uVar25) {
              pdVar9 = (pSVar4->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = (ulong)(uVar25 & 0x7fffffff) + 1;
              do {
                pdVar8[lVar15 + 0xfffffffffffffffe] =
                     pdVar8[lVar15 + 0xfffffffffffffffe] - pdVar9[lVar15 + -2];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          goto LAB_001d117e;
        }
        if (pSVar4 == (SSVectorBase<double> *)0x0) goto LAB_001d102a;
        pUVar3 = this->theFvec;
        pSVar21 = this->solveVector2rhs;
        if ((this->super_SPxBasisBase<double>).factorized == false) {
          SPxBasisBase<double>::factorize(local_118);
        }
        pSVar7 = (this->super_SPxBasisBase<double>).factor;
        (*pSVar7->_vptr_SLinSolver[0x11])(pSVar7,&pUVar3->thedelta,pSVar4,rhs,pSVar21);
      }
      this_00 = (this->super_SPxLPBase<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar1 = this_00->s_epsilon_multiplier;
      uVar23 = -(ulong)(dVar1 == 1.0);
      local_98 = (double)(~uVar23 & (ulong)(dVar1 * 1e-10) | uVar23 & 0x3ddb7cdfd9d7bdbb);
      local_78 = (SVectorBase<double> *)
                 ABS((this->theFvec->thedelta).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar19]);
      uStack_90 = 0;
      uStack_70 = 0;
      if ((double)local_78 < local_98) {
        if (local_e8._0_1_ == '\0') {
          SSVectorBase<double>::clear(&this->theFvec->thedelta);
          (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                    (this,(ulong)local_fc,local_b0,(ulong)local_11c,rhs);
          (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                    (local_118,0xffffffff,&local_a8,0,0);
          local_c8 = 0.0;
          dStack_c0 = 0.0;
          pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar8[lVar19] = pdVar8[lVar19] * 0.01;
          uVar23 = 1;
          goto LAB_001d16aa;
        }
        pSVar16 = this->spxout;
        if ((pSVar16 != (SPxOut *)0x0) && (4 < (int)pSVar16->m_verbosity)) {
          local_d8 = 5;
          local_f8 = pSVar16->m_verbosity;
          (*pSVar16->_vptr_SPxOut[2])();
          pSVar16 = this->spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar16->m_streams[pSVar16->m_verbosity],
                     "ILEAVE03 unboundedness/infeasibility found ",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar16->m_streams[pSVar16->m_verbosity],"in leave()",10);
          cVar12 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) +
                          cVar12);
          std::ostream::put(cVar12);
          std::ostream::flush();
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_f8);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                  (this,(ulong)local_fc,local_b0,(ulong)local_11c,0);
        (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (local_118,0xffffffff,&local_a8,0,0);
        local_c8 = 0.0;
        dStack_c0 = 0.0;
        if (this->theRep == ROW) {
          computePrimalray4Row(this,local_f0);
          if (this->m_status == OPTIMAL) {
            this->m_status = UNKNOWN;
          }
          if ((this->super_SPxBasisBase<double>).thestatus != UNBOUNDED) {
            (this->super_SPxBasisBase<double>).thestatus = UNBOUNDED;
          }
        }
        else {
          computeDualfarkas4Col(this,local_f0);
          if (this->m_status == OPTIMAL) {
            this->m_status = UNKNOWN;
          }
          if ((this->super_SPxBasisBase<double>).thestatus != INFEASIBLE) {
            (this->super_SPxBasisBase<double>).thestatus = INFEASIBLE;
          }
        }
        bVar22 = 0;
        uVar24 = (undefined4)local_98;
        uVar26 = local_98._4_4_;
      }
      else {
        local_e8 = local_a0;
        RVar11 = Tolerances::epsilon(this_00);
        if (RVar11 < local_e8) {
LAB_001d123a:
          pSVar10 = (this->super_SPxBasisBase<double>).matrix.data[lVar19];
          lVar15 = (long)pSVar10->memused;
          if (0 < lVar15) {
            pdVar8 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar17 = lVar15 + 1;
            piVar18 = &pSVar10->m_elem[lVar15 + -1].idx;
            do {
              pdVar8[*piVar18] =
                   pdVar8[*piVar18] - ((Nonzero<double> *)(piVar18 + -2))->val * local_a0;
              lVar17 = lVar17 + -1;
              piVar18 = piVar18 + -4;
            } while (1 < lVar17);
          }
        }
        else {
          local_e8 = local_a0;
          RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (local_e8 < -RVar11) goto LAB_001d123a;
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x80])
                  (SUB84(local_d0,0),this,local_b8,&local_f8,&local_d8,local_58,&local_60,&local_c8)
        ;
        uVar23 = (ulong)local_7c;
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = (double)CONCAT44(uStack_d4,local_d8);
        (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = local_58[0];
        (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = local_60;
        local_e8 = (double)CONCAT44(uStack_f4,local_f8);
        RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if (RVar11 < local_e8) {
LAB_001d1368:
          lVar15 = (long)rhs->memused;
          if (0 < lVar15) {
            pdVar8 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar17 = lVar15 + 1;
            piVar18 = &rhs->m_elem[lVar15 + -1].idx;
            do {
              pdVar8[*piVar18] =
                   (double)CONCAT44(uStack_f4,local_f8) * ((Nonzero<double> *)(piVar18 + -2))->val +
                   pdVar8[*piVar18];
              lVar17 = lVar17 + -1;
              piVar18 = piVar18 + -4;
            } while (1 < lVar17);
          }
        }
        else {
          local_e8 = (double)CONCAT44(uStack_f4,local_f8);
          RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (local_e8 < -RVar11) goto LAB_001d1368;
        }
        local_e8 = local_f0;
        this->theCoPvec->theval = local_f0;
        this->thePvec->theval = local_f0;
        RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if (RVar11 < local_e8) {
LAB_001d1416:
          (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
        }
        else {
          local_e8 = local_f0;
          RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (local_e8 < -RVar11) goto LAB_001d1416;
        }
        pUVar3 = this->theFvec;
        pUVar3->theval =
             -((pUVar3->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar19] - local_a0) /
             (pUVar3->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar19];
        UpdateVector<double>::update(pUVar3);
        (this->theFvec->super_VectorBase<double>).val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar19] = (double)CONCAT44(uStack_f4,local_f8) - this->theFvec->theval;
        updateFtest(this);
        if (this->m_nonbasicValueUpToDate == true) {
          this->m_nonbasicValue = local_c8 + dStack_c0 + this->m_nonbasicValue;
          nonbasicValue(this);
        }
        (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (local_118,uVar23,&local_b8,rhs,&this->theFvec->thedelta);
LAB_001d16aa:
        bVar22 = (byte)uVar23;
        uVar24 = (undefined4)local_98;
        uVar26 = local_98._4_4_;
      }
      if ((double)local_78 <= (double)CONCAT44(uVar26,uVar24) &&
          (double)CONCAT44(uVar26,uVar24) != (double)local_78) goto LAB_001d1872;
    }
    local_118 = (SPxBasisBase<double> *)local_d0;
    dVar1 = entertol(this);
    if (dVar1 < (double)local_118) {
      local_118 = (SPxBasisBase<double> *)local_f0;
      dVar1 = entertol(this);
      if (dVar1 < (double)local_118) goto LAB_001d180e;
LAB_001d188b:
      local_118 = (SPxBasisBase<double> *)
                  (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar19];
      ::soplex::infinity::__tls_init();
      if (*(double *)(in_FS_OFFSET + -8) <= (double)local_118) {
        local_e8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar19];
        uStack_110 = 0;
        local_118 = (SPxBasisBase<double> *)*(double *)(in_FS_OFFSET + -8);
        ::soplex::infinity::__tls_init();
        bVar22 = 1;
        if ((local_e8 <= -(double)local_118) || (local_11c == 0xffffffff)) goto LAB_001d1872;
      }
      else if (local_11c == 0xffffffff) goto LAB_001d186f;
      bVar22 = 1;
      if (local_11c != 1) {
        this->m_numCycle = this->m_numCycle + 1;
        this->leaveCycles = this->leaveCycles + 1;
      }
      goto LAB_001d1872;
    }
LAB_001d180e:
    local_118 = (SPxBasisBase<double> *)local_d0;
    dVar1 = entertol(this);
    if ((double)local_118 < -dVar1) {
      local_118 = (SPxBasisBase<double> *)local_f0;
      dVar1 = entertol(this);
      if (-dVar1 <= (double)local_118) goto LAB_001d188b;
    }
    this->m_numCycle = this->m_numCycle / 2;
  }
LAB_001d186f:
  bVar22 = 1;
LAB_001d1872:
  return (bool)(bVar22 & 1);
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}